

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O2

void __thiscall ON_UuidList::PurgeHelper(ON_UuidList *this)

{
  uchar *puVar1;
  ON_UUID_struct *pOVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int i;
  long lVar8;
  long lVar9;
  
  iVar6 = (this->super_ON_SimpleArray<ON_UUID_struct>).m_count;
  if (0 < this->m_removed_count && this->m_removed_count <= iVar6) {
    this->m_removed_count = 0;
    lVar9 = 0;
    iVar7 = 0;
    for (lVar8 = 0; lVar8 < iVar6; lVar8 = lVar8 + 1) {
      bVar5 = ::operator==(&ON_max_uuid,
                           (ON_UUID_struct *)
                           (((this->super_ON_SimpleArray<ON_UUID_struct>).m_a)->Data4 + lVar9 + -8))
      ;
      if (!bVar5) {
        if (iVar7 < lVar8) {
          pOVar2 = (this->super_ON_SimpleArray<ON_UUID_struct>).m_a;
          puVar1 = pOVar2->Data4 + lVar9 + -8;
          uVar3 = *(undefined8 *)puVar1;
          uVar4 = *(undefined8 *)(puVar1 + 8);
          pOVar2 = pOVar2 + iVar7;
          pOVar2->Data1 = (int)uVar3;
          pOVar2->Data2 = (short)((ulong)uVar3 >> 0x20);
          pOVar2->Data3 = (short)((ulong)uVar3 >> 0x30);
          *(undefined8 *)pOVar2->Data4 = uVar4;
        }
        iVar7 = iVar7 + 1;
      }
      iVar6 = (this->super_ON_SimpleArray<ON_UUID_struct>).m_count;
      lVar9 = lVar9 + 0x10;
    }
    if (iVar7 < iVar6) {
      (this->super_ON_SimpleArray<ON_UUID_struct>).m_count = iVar7;
      if (iVar7 < 1) {
        this->m_sorted_count = 0;
      }
      else {
        iVar6 = 1;
        while ((this->m_sorted_count = iVar6, iVar6 < iVar7 &&
               (pOVar2 = (this->super_ON_SimpleArray<ON_UUID_struct>).m_a,
               iVar6 = ON_UuidCompare(pOVar2 + (long)iVar6 + -1,pOVar2 + iVar6), iVar6 < 1))) {
          iVar7 = (this->super_ON_SimpleArray<ON_UUID_struct>).m_count;
          iVar6 = this->m_sorted_count + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void ON_UuidList::PurgeHelper()
{
  if ( m_removed_count <= m_count && m_removed_count > 0 )
  {
    m_removed_count = 0;

    // purge removed ids
    int count = 0;
    for ( int i = 0; i < m_count; i++ )
    {
      if ( ON_max_uuid == m_a[i] )
        continue;

      if ( i > count )
        m_a[count] = m_a[i];

      count++;
    }

    if ( count < m_count )
    {
      m_count = count;
      if ( count > 0 )
      {
        // set m_sorted_count
        for ( m_sorted_count = 1; m_sorted_count < m_count; m_sorted_count++ )
        {
          if ( ON_UuidCompare(m_a[m_sorted_count-1],m_a[m_sorted_count])> 0 )
            break;
        }
      }
      else
      {
        m_sorted_count = 0;
      }
    }
  }
}